

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

size_t __thiscall caffe::LRNParameter::ByteSizeLong(LRNParameter *this)

{
  bool bVar1;
  LRNParameter_NormRegion value;
  LRNParameter_Engine value_00;
  uint32 value_01;
  int iVar2;
  UnknownFieldSet *unknown_fields;
  size_t sVar3;
  size_t sStack_38;
  int cached_size;
  size_t total_size;
  LRNParameter *this_local;
  
  sStack_38 = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = LRNParameter::unknown_fields(this);
    sStack_38 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  if (((this->_has_bits_).has_bits_[0] & 0x3f) != 0) {
    bVar1 = has_norm_region(this);
    if (bVar1) {
      value = norm_region(this);
      sVar3 = google::protobuf::internal::WireFormatLite::EnumSize(value);
      sStack_38 = sVar3 + 1 + sStack_38;
    }
    bVar1 = has_engine(this);
    if (bVar1) {
      value_00 = engine(this);
      sVar3 = google::protobuf::internal::WireFormatLite::EnumSize(value_00);
      sStack_38 = sVar3 + 1 + sStack_38;
    }
    bVar1 = has_local_size(this);
    if (bVar1) {
      value_01 = local_size(this);
      sVar3 = google::protobuf::internal::WireFormatLite::UInt32Size(value_01);
      sStack_38 = sVar3 + 1 + sStack_38;
    }
    bVar1 = has_alpha(this);
    if (bVar1) {
      sStack_38 = sStack_38 + 5;
    }
    bVar1 = has_beta(this);
    if (bVar1) {
      sStack_38 = sStack_38 + 5;
    }
    bVar1 = has_k(this);
    if (bVar1) {
      sStack_38 = sStack_38 + 5;
    }
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_38);
  this->_cached_size_ = iVar2;
  return sStack_38;
}

Assistant:

size_t LRNParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.LRNParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 63u) {
    // optional .caffe.LRNParameter.NormRegion norm_region = 4 [default = ACROSS_CHANNELS];
    if (has_norm_region()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->norm_region());
    }

    // optional .caffe.LRNParameter.Engine engine = 6 [default = DEFAULT];
    if (has_engine()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->engine());
    }

    // optional uint32 local_size = 1 [default = 5];
    if (has_local_size()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->local_size());
    }

    // optional float alpha = 2 [default = 1];
    if (has_alpha()) {
      total_size += 1 + 4;
    }

    // optional float beta = 3 [default = 0.75];
    if (has_beta()) {
      total_size += 1 + 4;
    }

    // optional float k = 5 [default = 1];
    if (has_k()) {
      total_size += 1 + 4;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}